

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

string * __thiscall
lscpp::stdio_transporter::read_message_abi_cxx11_
          (string *__return_storage_ptr__,stdio_transporter *this,size_t length)

{
  pointer pcVar1;
  optional<lscpp::comm_logger> *logger;
  size_t in_RCX;
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  size_t length_local;
  stdio_transporter *this_local;
  string *res;
  
  reserve(this,length);
  this_00 = &this->data_;
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  read(0,pcVar1,length);
  logger = (optional<lscpp::comm_logger> *)
           std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  anon_unknown_0::log_in_message((anon_unknown_0 *)this,logger,(void *)length,in_RCX);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stdio_transporter::read_message(std::size_t length) {
  reserve(length);
  ::read(stdin_fileno, data_.get(), length);

  log_in_message(comm_logger_, data_.get(), length);

  std::string res;
  res.append(data_.get(), length);
  return res;
}